

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool __thiscall
testing::internal::MaxBipartiteMatchState::TryAugment
          (MaxBipartiteMatchState *this,size_t ilhs,vector<char,_std::allocator<char>_> *seen)

{
  bool bVar1;
  vector<char,_std::allocator<char>_> *pvVar2;
  reference pvVar3;
  reference pvVar4;
  vector<char,_std::allocator<char>_> *in_RDX;
  MaxBipartiteMatchState *in_RSI;
  MatchMatrix *in_RDI;
  size_t irhs;
  size_t in_stack_ffffffffffffffc0;
  vector<char,_std::allocator<char>_> *pvVar5;
  vector<char,_std::allocator<char>_> *seen_00;
  
  pvVar5 = (vector<char,_std::allocator<char>_> *)0x0;
  do {
    seen_00 = pvVar5;
    pvVar2 = (vector<char,_std::allocator<char>_> *)MatchMatrix::RhsSize(*(MatchMatrix **)in_RDI);
    if (pvVar2 <= pvVar5) {
      return false;
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDX,(size_type)seen_00);
    if ((*pvVar3 == '\0') &&
       (bVar1 = MatchMatrix::HasEdge(in_RDI,(size_t)pvVar5,in_stack_ffffffffffffffc0), bVar1)) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDX,(size_type)seen_00);
      *pvVar3 = '\x01';
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                          (size_type)seen_00);
      if (*pvVar4 == 0xffffffffffffffff) {
LAB_0013f20d:
        pvVar5 = seen_00;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),
                            (size_type)in_RSI);
        *pvVar4 = (value_type)seen_00;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20)
                            ,(size_type)pvVar5);
        *pvVar4 = (value_type)in_RSI;
        return true;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                 (size_type)seen_00);
      bVar1 = TryAugment(in_RSI,(size_t)in_RDX,seen_00);
      if (bVar1) goto LAB_0013f20d;
    }
    pvVar5 = (vector<char,_std::allocator<char>_> *)
             &(seen_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x1;
  } while( true );
}

Assistant:

bool TryAugment(size_t ilhs, ::std::vector<char>* seen) {
    for (size_t irhs = 0; irhs < graph_->RhsSize(); ++irhs) {
      if ((*seen)[irhs])
        continue;
      if (!graph_->HasEdge(ilhs, irhs))
        continue;
      // There's an available edge from ilhs to irhs.
      (*seen)[irhs] = 1;
      // Next a search is performed to determine whether
      // this edge is a dead end or leads to the sink.
      //
      // right_[irhs] == kUnused means that there is residual flow from
      // right node irhs to the sink, so we can use that to finish this
      // flow path and return success.
      //
      // Otherwise there is residual flow to some ilhs. We push flow
      // along that path and call ourselves recursively to see if this
      // ultimately leads to sink.
      if (right_[irhs] == kUnused || TryAugment(right_[irhs], seen)) {
        // Add flow from left_[ilhs] to right_[irhs].
        left_[ilhs] = irhs;
        right_[irhs] = ilhs;
        return true;
      }
    }
    return false;
  }